

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void VP8LColorSpaceTransform
               (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image)

{
  VP8LMultipliers prev_x_00;
  VP8LMultipliers VVar1;
  int tile_x_00;
  int bits_00;
  int quality_00;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  long in_R8;
  long in_R9;
  uint32_t pix;
  int ix_end;
  int ix;
  int offset;
  int all_y_max;
  int all_x_max;
  int tile_y_offset;
  int tile_x_offset;
  int y;
  VP8LMultipliers prev_y;
  VP8LMultipliers prev_x;
  int tile_y;
  int tile_x;
  int accumulated_blue_histo [256];
  int accumulated_red_histo [256];
  int tile_ysize;
  int tile_xsize;
  int max_tile_size;
  uint32_t max_tile_size_00;
  int in_stack_fffffffffffff764;
  int *piVar5;
  int *piVar6;
  undefined4 in_stack_fffffffffffff780;
  uint in_stack_fffffffffffff784;
  int local_874;
  int in_stack_fffffffffffff7b4;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffff7b8;
  uint8_t in_stack_fffffffffffff7b9;
  uint8_t in_stack_fffffffffffff7ba;
  uint8_t in_stack_fffffffffffff7bb;
  uint8_t in_stack_fffffffffffff7bc;
  int local_840;
  int local_83c;
  int local_838 [2];
  int in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d8;
  int *in_stack_fffffffffffff7e0;
  int *in_stack_fffffffffffff7e8;
  uint32_t *in_stack_fffffffffffff7f0;
  int local_438 [257];
  uint32_t local_34;
  uint32_t local_30;
  int local_2c;
  long local_28;
  long local_20;
  uint32_t local_14;
  uint32_t local_10;
  uint32_t local_c;
  
  local_2c = 1 << ((byte)in_EDX & 0x1f);
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_EDX;
  local_10 = in_ESI;
  local_c = in_EDI;
  local_30 = VP8LSubSampleSize(in_EDI,in_EDX);
  local_34 = VP8LSubSampleSize(local_10,local_14);
  memset(local_438,0,0x400);
  memset(local_838,0,0x400);
  MultipliersClear((VP8LMultipliers *)&stack0xfffffffffffff7b9);
  MultipliersClear((VP8LMultipliers *)&stack0xfffffffffffff7bc);
  for (local_840 = 0; local_840 < (int)local_34; local_840 = local_840 + 1) {
    for (local_83c = 0; uVar7 = (undefined1)((uint)in_stack_fffffffffffff7b4 >> 0x18),
        local_83c < (int)local_30; local_83c = local_83c + 1) {
      tile_x_00 = local_83c * local_2c;
      in_stack_fffffffffffff7b4 = local_840 * local_2c;
      bits_00 = GetMin(tile_x_00 + local_2c,local_c);
      quality_00 = GetMin(in_stack_fffffffffffff7b4 + local_2c,local_10);
      iVar2 = local_840 * local_30 + local_83c;
      if (local_840 != 0) {
        ColorCodeToMultipliers
                  (*(uint32_t *)(local_28 + (long)(int)(iVar2 - local_30) * 4),
                   (VP8LMultipliers *)&stack0xfffffffffffff7b9);
      }
      piVar6 = local_838;
      piVar5 = local_438;
      prev_x_00.green_to_blue_ = in_stack_fffffffffffff7bb;
      prev_x_00.green_to_red_ = in_stack_fffffffffffff7ba;
      prev_x_00.red_to_blue_ = in_stack_fffffffffffff7bc;
      VVar1.green_to_blue_ = in_stack_fffffffffffff7b8;
      VVar1.green_to_red_ = uVar7;
      VVar1.red_to_blue_ = in_stack_fffffffffffff7b9;
      max_tile_size_00 = local_10;
      VVar1 = GetBestColorTransformForTile
                        (tile_x_00,in_stack_fffffffffffff7b4,bits_00,prev_x_00,VVar1,quality_00,
                         in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8,
                         in_stack_fffffffffffff7e0,in_stack_fffffffffffff7e8,
                         in_stack_fffffffffffff7f0);
      in_stack_fffffffffffff7bc = VVar1.green_to_red_;
      uVar3 = MultipliersToColorCode((VP8LMultipliers *)&stack0xfffffffffffff7bc);
      *(uint32_t *)(local_28 + (long)iVar2 * 4) = uVar3;
      CopyTileWithColorTransform
                ((int)piVar6,(int)((ulong)piVar5 >> 0x20),(int)piVar5,in_stack_fffffffffffff764,
                 max_tile_size_00,SUB83((ulong)piVar6 >> 0x28,0),
                 (uint32_t *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
      for (; in_stack_fffffffffffff7b4 < quality_00;
          in_stack_fffffffffffff7b4 = in_stack_fffffffffffff7b4 + 1) {
        local_874 = in_stack_fffffffffffff7b4 * local_c + tile_x_00;
        iVar2 = local_874 + bits_00;
        for (; local_874 < iVar2 - tile_x_00; local_874 = local_874 + 1) {
          in_stack_fffffffffffff784 = *(uint *)(local_20 + (long)local_874 * 4);
          if ((((local_874 < 2) ||
               (in_stack_fffffffffffff784 != *(uint *)(local_20 + (long)(local_874 + -2) * 4))) ||
              (in_stack_fffffffffffff784 != *(uint *)(local_20 + (long)(local_874 + -1) * 4))) &&
             (((local_874 < (int)(local_c + 2) ||
               (*(int *)(local_20 + (long)(local_874 + -2) * 4) !=
                *(int *)(local_20 + (long)(int)((local_874 - local_c) + -2) * 4))) ||
              ((*(int *)(local_20 + (long)(local_874 + -1) * 4) !=
                *(int *)(local_20 + (long)(int)((local_874 - local_c) + -1) * 4) ||
               (in_stack_fffffffffffff784 !=
                *(uint *)(local_20 + (long)(int)(local_874 - local_c) * 4))))))) {
            uVar4 = in_stack_fffffffffffff784 >> 0x10 & 0xff;
            local_438[uVar4] = local_438[uVar4] + 1;
            local_838[in_stack_fffffffffffff784 & 0xff] =
                 local_838[in_stack_fffffffffffff784 & 0xff] + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                             uint32_t* const argb, uint32_t* image) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int accumulated_red_histo[256] = { 0 };
  int accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
  }
}